

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

upb_MessageValue upb_MapIterator_Key(upb_Map *map,size_t iter)

{
  uintptr_t local_50;
  uintptr_t intkey;
  undefined1 local_38 [8];
  upb_strtable_iter i;
  size_t iter_local;
  upb_Map *map_local;
  upb_MessageValue ret;
  
  i.index = iter;
  if ((map->is_strtable_dont_copy_me__upb_internal_use_only & 1U) == 0) {
    local_50 = upb_inttable_iter_key(&(map->t).inttable,iter);
    memcpy(&map_local,&local_50,(long)map->key_size);
  }
  else {
    local_38 = (undefined1  [8])&map->t;
    i.t = (upb_strtable *)iter;
    _intkey = upb_strtable_iter_key((upb_strtable_iter *)local_38);
    _upb_map_fromkey(_intkey,&map_local,(long)map->key_size);
  }
  return _map_local;
}

Assistant:

upb_MessageValue upb_MapIterator_Key(const upb_Map* map, size_t iter) {
  upb_MessageValue ret;
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_strtable_iter i;
    i.t = &map->t.strtable;
    i.index = iter;
    _upb_map_fromkey(upb_strtable_iter_key(&i), &ret, map->key_size);
  } else {
    uintptr_t intkey = upb_inttable_iter_key(&map->t.inttable, iter);
    memcpy(&ret, &intkey, map->key_size);
  }
  return ret;
}